

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O3

void chrono::ChPeriodicPar(double *u,int closed)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *u;
  dVar2 = 0.0;
  if (dVar1 < 0.0) {
    if (closed == 0) goto LAB_004ed18c;
    dVar1 = dVar1 + 1.0;
    *u = dVar1;
  }
  if (dVar1 <= 1.0) {
    return;
  }
  dVar2 = (double)((ulong)(closed == 0) * 0x3ff0000000000000 +
                  (ulong)(closed != 0) * (long)(dVar1 + -1.0));
LAB_004ed18c:
  *u = dVar2;
  return;
}

Assistant:

void ChPeriodicPar(double& u, int closed) {
    if (u < 0) {
        if (closed)
            u = u + 1;
        else
            u = 0;
    }
    if (u > 1) {
        if (closed)
            u = u - 1;
        else
            u = 1;
    }
}